

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RunLength.cc
# Opt level: O2

void __thiscall Pl_RunLength::encode(Pl_RunLength *this,uchar *data,size_t len)

{
  uint *puVar1;
  uchar uVar2;
  state_e sVar3;
  uint uVar4;
  Members *pMVar5;
  logic_error *this_00;
  ulong uVar6;
  size_t sVar7;
  
  sVar7 = 0;
  do {
    if (len == sVar7) {
      return;
    }
    pMVar5 = (this->m)._M_t.
             super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
             ._M_t.
             super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
             .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
    sVar3 = pMVar5->state;
    uVar4 = pMVar5->length;
    uVar6 = (ulong)uVar4;
    if (1 < uVar4 == (sVar3 == st_top)) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Pl_RunLength::encode: state/length inconsistency");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    uVar2 = data[sVar7];
    if (uVar4 == 0) {
      uVar6 = 0;
      if (sVar3 == st_run) goto LAB_0012efa0;
    }
    else {
      if (sVar3 == st_copying || uVar4 < 0x80) {
        if (uVar2 == pMVar5->buf[uVar4 - 1]) {
          if (sVar3 == st_copying) {
            pMVar5->length = uVar4 - 1;
            flush_encode(this);
            ((this->m)._M_t.
             super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
             ._M_t.
             super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
             .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl)->buf[0] = uVar2;
            pMVar5 = (this->m)._M_t.
                     super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
                     .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
            pMVar5->length = 1;
            uVar6 = 1;
          }
          pMVar5->state = st_run;
          goto LAB_0012efb2;
        }
      }
      if (sVar3 == st_run || uVar4 == 0x80) {
LAB_0012efa0:
        flush_encode(this);
        pMVar5 = (this->m)._M_t.
                 super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
                 .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
        uVar6 = (ulong)pMVar5->length;
      }
      else {
        pMVar5->state = st_copying;
      }
    }
LAB_0012efb2:
    pMVar5->buf[uVar6] = uVar2;
    puVar1 = &((this->m)._M_t.
               super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
               ._M_t.
               super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
               .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl)->length;
    *puVar1 = *puVar1 + 1;
    sVar7 = sVar7 + 1;
  } while( true );
}

Assistant:

void
Pl_RunLength::encode(unsigned char const* data, size_t len)
{
    for (size_t i = 0; i < len; ++i) {
        if ((m->state == st_top) != (m->length <= 1)) {
            throw std::logic_error("Pl_RunLength::encode: state/length inconsistency");
        }
        unsigned char ch = data[i];
        if ((m->length > 0) && ((m->state == st_copying) || (m->length < 128)) &&
            (ch == m->buf[m->length - 1])) {
            QTC::TC("libtests", "Pl_RunLength: switch to run", (m->length == 128) ? 0 : 1);
            if (m->state == st_copying) {
                --m->length;
                flush_encode();
                m->buf[0] = ch;
                m->length = 1;
            }
            m->state = st_run;
            m->buf[m->length] = ch;
            ++m->length;
        } else {
            if ((m->length == 128) || (m->state == st_run)) {
                flush_encode();
            } else if (m->length > 0) {
                m->state = st_copying;
            }
            m->buf[m->length] = ch;
            ++m->length;
        }
    }
}